

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_modifiers.cc
# Opt level: O0

void __thiscall
ctemplate::CssUrlEscape::Modify
          (CssUrlEscape *this,char *in,size_t inlen,PerExpandData *param_3,ExpandEmitter *out,
          string *arg)

{
  ulong uStack_40;
  char c;
  size_t i;
  string *arg_local;
  ExpandEmitter *out_local;
  PerExpandData *param_3_local;
  size_t inlen_local;
  char *in_local;
  CssUrlEscape *this_local;
  
  for (uStack_40 = 0; uStack_40 < inlen; uStack_40 = uStack_40 + 1) {
    switch(in[uStack_40]) {
    case '\n':
      (*out->_vptr_ExpandEmitter[5])(out,"%0A",3);
      break;
    default:
      (*out->_vptr_ExpandEmitter[2])(out,(ulong)(uint)(int)in[uStack_40]);
      break;
    case '\r':
      (*out->_vptr_ExpandEmitter[5])(out,"%0D",3);
      break;
    case '\"':
      (*out->_vptr_ExpandEmitter[5])(out,"%22",3);
      break;
    case '\'':
      (*out->_vptr_ExpandEmitter[5])(out,"%27",3);
      break;
    case '(':
      (*out->_vptr_ExpandEmitter[5])(out,"%28",3);
      break;
    case ')':
      (*out->_vptr_ExpandEmitter[5])(out,"%29",3);
      break;
    case '*':
      (*out->_vptr_ExpandEmitter[5])(out,"%2A",3);
      break;
    case '<':
      (*out->_vptr_ExpandEmitter[5])(out,"%3C",3);
      break;
    case '>':
      (*out->_vptr_ExpandEmitter[5])(out,"%3E",3);
      break;
    case '\\':
      (*out->_vptr_ExpandEmitter[5])(out,"%5C",3);
    }
  }
  return;
}

Assistant:

void CssUrlEscape::Modify(const char* in, size_t inlen,
                          const PerExpandData*,
                          ExpandEmitter* out, const string& arg) const {
  for (size_t i = 0; i < inlen; ++i) {
    char c = in[i];
    switch (c) {
      case '\n': APPEND("%0A"); break;
      case '\r': APPEND("%0D"); break;
      case '"':  APPEND("%22"); break;
      case '\'': APPEND("%27"); break;
      case '(':  APPEND("%28"); break;
      case ')':  APPEND("%29"); break;
      case '*':  APPEND("%2A"); break;
      case '<':  APPEND("%3C"); break;
      case '>':  APPEND("%3E"); break;
      case '\\': APPEND("%5C"); break;
      default: out->Emit(c); break;
    }
  }
}